

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

int __thiscall doctest::String::compare(String *this,char *other,bool no_case)

{
  char cVar1;
  int iVar2;
  int iVar3;
  undefined3 in_register_00000011;
  long lVar4;
  
  if ((this->field_0).buf[0x17] < '\0') {
    this = (String *)(this->field_0).data.ptr;
  }
  if (CONCAT31(in_register_00000011,no_case) == 0) {
    iVar2 = strcmp((char *)this,other);
    return iVar2;
  }
  cVar1 = (this->field_0).buf[0];
  iVar2 = tolower((int)cVar1);
  iVar3 = tolower((int)*other);
  if (iVar2 == iVar3 && cVar1 != '\0') {
    lVar4 = 1;
    do {
      cVar1 = (this->field_0).buf[lVar4];
      iVar2 = tolower((int)cVar1);
      iVar3 = tolower((int)other[lVar4]);
      if (cVar1 == '\0') break;
      lVar4 = lVar4 + 1;
    } while (iVar2 == iVar3);
  }
  return iVar2 - iVar3;
}

Assistant:

int String::compare(const char* other, bool no_case) const {
    if(no_case)
        return doctest::stricmp(c_str(), other);
    return std::strcmp(c_str(), other);
}